

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

void run_ecmult_bench(bench_data *data,int iters)

{
  undefined4 in_ESI;
  _func_void_void_ptr_int *in_RDI;
  char *unaff_retaddr;
  char str [32];
  char local_38 [20];
  int in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  _func_void_void_ptr_int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  sprintf(local_38,"ecmult_gen");
  run_benchmark(unaff_retaddr,in_RDI,
                (_func_void_void_ptr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                str._0_4_);
  sprintf(local_38,"ecmult_const");
  run_benchmark(unaff_retaddr,in_RDI,
                (_func_void_void_ptr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                str._0_4_);
  sprintf(local_38,"ecmult_1p");
  run_benchmark(unaff_retaddr,in_RDI,
                (_func_void_void_ptr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                str._0_4_);
  sprintf(local_38,"ecmult_0p_g");
  run_benchmark(unaff_retaddr,in_RDI,
                (_func_void_void_ptr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                str._0_4_);
  sprintf(local_38,"ecmult_1p_g");
  run_benchmark(unaff_retaddr,in_RDI,
                (_func_void_void_ptr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                str._0_4_);
  return;
}

Assistant:

static void run_ecmult_bench(bench_data* data, int iters) {
    char str[32];
    sprintf(str, "ecmult_gen");
    run_benchmark(str, bench_ecmult_gen, bench_ecmult_setup, bench_ecmult_gen_teardown, data, 10, iters);
    sprintf(str, "ecmult_const");
    run_benchmark(str, bench_ecmult_const, bench_ecmult_setup, bench_ecmult_const_teardown, data, 10, iters);
    /* ecmult with non generator point */
    sprintf(str, "ecmult_1p");
    run_benchmark(str, bench_ecmult_1p, bench_ecmult_setup, bench_ecmult_1p_teardown, data, 10, iters);
    /* ecmult with generator point */
    sprintf(str, "ecmult_0p_g");
    run_benchmark(str, bench_ecmult_0p_g, bench_ecmult_setup, bench_ecmult_0p_g_teardown, data, 10, iters);
    /* ecmult with generator and non-generator point. The reported time is per point. */
    sprintf(str, "ecmult_1p_g");
    run_benchmark(str, bench_ecmult_1p_g, bench_ecmult_setup, bench_ecmult_1p_g_teardown, data, 10, 2*iters);
}